

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::robin_hash(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *this,size_type bucket_count,hash<unsigned_long> *hash,equal_to<unsigned_long> *equal,
            allocator<std::pair<unsigned_long,_double>_> *alloc,float min_load_factor,
            float max_load_factor)

{
  bucket_entry *pbVar1;
  ulong uVar2;
  length_error *this_00;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dd;
  float fVar3;
  undefined4 in_XMM1_Db;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  allocator_type local_41;
  size_type local_40;
  float local_38;
  undefined4 uStack_34;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_1c;
  undefined1 auVar5 [16];
  
  local_40 = bucket_count;
  local_38 = max_load_factor;
  uStack_34 = in_XMM1_Db;
  local_28 = min_load_factor;
  uStack_24 = in_XMM0_Db;
  uStack_1c = in_XMM0_Dd;
  rh::power_of_two_growth_policy<2UL>::power_of_two_growth_policy
            (&this->super_power_of_two_growth_policy<2UL>,&local_40);
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
  ::vector(&this->m_buckets_data,local_40,&local_41);
  pbVar1 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (this->m_buckets_data).
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar1 = static_empty_bucket_ptr(this);
  }
  this->m_buckets = pbVar1;
  this->m_bucket_count = local_40;
  this->m_nb_elements = 0;
  this->m_grow_on_next_insert = false;
  this->m_try_shrink_on_next_insert = false;
  if (local_40 < 0x555555555555556) {
    if (local_40 != 0) {
      (this->m_buckets_data).
      super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].m_last_bucket = true;
    }
    auVar4._4_4_ = uStack_24;
    auVar4._0_4_ = local_28;
    auVar4._8_4_ = uStack_24;
    auVar4._12_4_ = uStack_1c;
    auVar6._8_8_ = auVar4._8_8_;
    auVar6._4_4_ = local_38;
    auVar6._0_4_ = local_28;
    auVar5._0_12_ = auVar6._0_12_;
    auVar5._12_4_ = uStack_34;
    auVar6 = maxps(auVar5,_DAT_0036e220);
    auVar6 = minps(auVar6,_DAT_0036e230);
    this->m_min_load_factor = (float)(int)auVar6._0_8_;
    this->m_max_load_factor = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
    fVar3 = auVar6._4_4_ * (float)(long)local_40;
    uVar2 = (ulong)fVar3;
    this->m_load_threshold = (long)(fVar3 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"The map exceeds its maximum bucket count.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

robin_hash(size_type bucket_count, const Hash& hash, const KeyEqual& equal,
             const Allocator& alloc,
             float min_load_factor = DEFAULT_MIN_LOAD_FACTOR,
             float max_load_factor = DEFAULT_MAX_LOAD_FACTOR)
      : Hash(hash),
        KeyEqual(equal),
        GrowthPolicy(bucket_count),
        m_buckets_data(bucket_count, alloc),
        m_buckets(m_buckets_data.empty() ? static_empty_bucket_ptr()
                                         : m_buckets_data.data()),
        m_bucket_count(bucket_count),
        m_nb_elements(0),
        m_grow_on_next_insert(false),
        m_try_shrink_on_next_insert(false) {
    if (bucket_count > max_bucket_count()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The map exceeds its maximum bucket count.");
    }

    if (m_bucket_count > 0) {
      tsl_rh_assert(!m_buckets_data.empty());
      m_buckets_data.back().set_as_last_bucket();
    }

    this->min_load_factor(min_load_factor);
    this->max_load_factor(max_load_factor);
  }